

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timestamp.cpp
# Opt level: O0

Timestamp * __thiscall sznet::Timestamp::toString_abi_cxx11_(Timestamp *this)

{
  long *in_RSI;
  allocator local_49;
  long local_48;
  int64_t microseconds;
  int64_t seconds;
  char buf [32];
  Timestamp *this_local;
  
  seconds = 0;
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  microseconds = *in_RSI / 1000000;
  local_48 = *in_RSI % 1000000;
  snprintf((char *)&seconds,0x20,"%ldd.%06ldd",microseconds,local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,(char *)&seconds,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return this;
}

Assistant:

string Timestamp::toString() const
{
	char buf[32] = { 0 };
	int64_t seconds = m_microSecondsSinceEpoch / kMicroSecondsPerSecond;
	int64_t microseconds = m_microSecondsSinceEpoch % kMicroSecondsPerSecond;
	snprintf(buf, sizeof(buf), "%" PRId64 "d.%06" PRId64 "d", seconds, microseconds);
	return buf;
}